

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

void __thiscall FBX::Decoder::Decoder(Decoder *this,string *path)

{
  pointer pcVar1;
  
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + path->_M_string_length);
  Stream::Stream(&this->stream,path);
  this->version = 0;
  this->blockLength = 0;
  (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->isuInt32 = true;
  return;
}

Assistant:

Decoder::Decoder(const std::string &path) : path(path), stream(path) {}